

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O0

int __thiscall ktx::CommandExtract::OptionsExtract::init(OptionsExtract *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  OptionAdder *desc;
  OptionAdder *this_00;
  shared_ptr<cxxopts::Value> *in_stack_fffffffffffff808;
  shared_ptr<const_cxxopts::Value> *in_stack_fffffffffffff810;
  shared_ptr<const_cxxopts::Value> *this_01;
  allocator<char> *in_stack_fffffffffffff840;
  allocator<char> *__a;
  char *in_stack_fffffffffffff848;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff850;
  string *in_stack_fffffffffffff860;
  Options *in_stack_fffffffffffff868;
  string *in_stack_fffffffffffff930;
  string *arg_help;
  shared_ptr<const_cxxopts::Value> *in_stack_fffffffffffff938;
  shared_ptr<const_cxxopts::Value> *value;
  string *in_stack_fffffffffffff940;
  string *in_stack_fffffffffffff948;
  string *opts;
  OptionAdder *in_stack_fffffffffffff950;
  OptionAdder *this_02;
  allocator<char> local_659;
  string local_658 [71];
  undefined1 local_611 [40];
  allocator<char> local_5e9;
  string local_5e8 [39];
  allocator<char> local_5c1;
  string local_5c0 [71];
  allocator<char> local_579;
  string local_578 [39];
  allocator<char> local_551;
  string local_550 [39];
  allocator<char> local_529;
  string local_528 [71];
  allocator<char> local_4e1;
  string local_4e0 [39];
  allocator<char> local_4b9;
  string local_4b8 [39];
  allocator<char> local_491;
  string local_490 [71];
  allocator<char> local_449;
  string local_448 [39];
  allocator<char> local_421;
  string local_420 [39];
  allocator<char> local_3f9;
  string local_3f8 [71];
  allocator<char> local_3b1;
  string local_3b0 [39];
  allocator<char> local_389;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [71];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [71];
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [71];
  allocator<char> local_1e9;
  string local_1e8 [39];
  undefined1 local_1c1 [40];
  undefined1 local_199 [72];
  undefined1 local_151 [40];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [71];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [72];
  EVP_PKEY_CTX *local_10;
  OptionsExtract *local_8;
  
  local_10 = ctx;
  local_8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::Options::add_options(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff940,
             in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  this_02 = (OptionAdder *)local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  opts = (string *)local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  desc = cxxopts::OptionAdder::operator()
                   (this_02,opts,in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                    in_stack_fffffffffffff930);
  value = (shared_ptr<const_cxxopts::Value> *)local_1c1;
  arg_help = (string *)kTranscode;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::OptionAdder::operator()(this_02,opts,(string *)desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::OptionAdder::operator()(this_02,opts,(string *)desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::OptionAdder::operator()(this_02,opts,(string *)desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::OptionAdder::operator()(this_02,opts,(string *)desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::OptionAdder::operator()(this_02,opts,(string *)desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  this_00 = cxxopts::OptionAdder::operator()(this_02,opts,(string *)desc,value,arg_help);
  __s = &local_551;
  __a = (allocator<char> *)kAll;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,__a);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,__a);
  cxxopts::OptionAdder::operator()(this_02,opts,(string *)desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,__a);
  this_01 = (shared_ptr<const_cxxopts::Value> *)local_611;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,__a);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (this_01,in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,__a);
  cxxopts::OptionAdder::operator()(this_02,opts,(string *)desc,value,arg_help);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_659);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x26a1de);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x26a1eb);
  std::__cxx11::string::~string((string *)(local_611 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_611);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x26a246);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x26a253);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator(&local_579);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator(&local_529);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x26a2ae);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x26a2bb);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator(&local_491);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x26a316);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x26a323);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator(&local_449);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator(&local_421);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x26a37e);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x26a38b);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x26a3e6);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x26a3f3);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x26a44e);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x26a45b);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x26a4b6);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x26a4c3);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)(local_1c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1c1);
  std::__cxx11::string::~string((string *)(local_199 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_199);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x26a51e);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x26a52b);
  std::__cxx11::string::~string((string *)(local_151 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x26a586);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x26a593);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x26a5d4);
  std::__cxx11::string::~string(local_58);
  iVar1 = std::allocator<char>::~allocator(&local_59);
  return iVar1;
}

Assistant:

void CommandExtract::OptionsExtract::init(cxxopts::Options& opts) {
    opts.add_options()
            (kOutput, "Output filepath for single, output directory for multiple image export.", cxxopts::value<std::string>(), "<filepath>")
            (kStdout, "Use stdout as the output file. (Using a single dash '-' as the output file has the same effect)")
            (kTranscode, "Transcode the texture to the target format before executing the extract steps."
                          " Requires the input file to be transcodable."
                          " Block compressed transcode targets can only be saved in raw format."
                          " Case-insensitive."
                          "\nPossible options are:"
                          " etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc |"
                          " r8 | rg8 | rgb8 | rgba8."
                          "\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2.",
                          cxxopts::value<std::string>(), "<target>")
            (kUri, "KTX Fragment URI.", cxxopts::value<std::string>(), "<uri>")
            (kLevel, "Level to extract. When 'all' is used every level is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-9]+ | all")
            (kLayer, "Layer to extract. When 'all' is used every layer is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-9]+ | all")
            (kFace, "Face to extract. When 'all' is used every face is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-5] | all")
            (kDepth, "Depth slice to extract. When 'all' is used every depth is exported. Defaults to 0.", cxxopts::value<std::string>(), "[0-9]+ | all")
            (kAll, "Extract every image slice from the texture.")
            (kRaw, "Extract the raw image data without any conversion.");
}